

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

_Bool obj_has_flag(object *obj,wchar_t flag)

{
  curse_data *pcVar1;
  _Bool _Var2;
  int local_2c;
  wchar_t i;
  curse_data *c;
  wchar_t flag_local;
  object *obj_local;
  
  pcVar1 = obj->curses;
  _Var2 = flag_has_dbg(obj->flags,5,flag,"obj->flags","flag");
  if (_Var2) {
    obj_local._7_1_ = true;
  }
  else {
    if (pcVar1 != (curse_data *)0x0) {
      for (local_2c = 1; local_2c < (int)(uint)z_info->curse_max; local_2c = local_2c + 1) {
        if ((pcVar1[local_2c].power != L'\0') &&
           (_Var2 = flag_has_dbg((curses[local_2c].obj)->flags,5,flag,"curses[i].obj->flags","flag")
           , _Var2)) {
          return true;
        }
      }
    }
    obj_local._7_1_ = false;
  }
  return obj_local._7_1_;
}

Assistant:

bool obj_has_flag(const struct object *obj, int flag)
{
	struct curse_data *c = obj->curses;

	/* Check the object's own flags */
	if (of_has(obj->flags, flag)) {
		return true;
	}

	/* Check any curse object flags */
	if (c) {
		int i;
		for (i = 1; i < z_info->curse_max; i++) {
			if (c[i].power && of_has(curses[i].obj->flags, flag)) {
				return true;
			}
		}
	}
	return false;
}